

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

ctl_arena_t * arenas_i(size_t i)

{
  ulong uVar1;
  long *in_FS_OFFSET;
  
  if (*(char *)(*in_FS_OFFSET + -0x2758) != '\0') {
    duckdb_je_tsd_fetch_slow((tsd_t *)(*in_FS_OFFSET + -0x2a90),false);
  }
  if (i != 0x1000) {
    if (i == 0x1001) {
      uVar1 = 1;
      goto LAB_0115c551;
    }
    if (ctl_arenas->narenas != i) {
      uVar1 = (ulong)((int)i + 2);
      goto LAB_0115c551;
    }
  }
  uVar1 = 0;
LAB_0115c551:
  return ctl_arenas->duckdb_je_arenas[uVar1];
}

Assistant:

static ctl_arena_t *
arenas_i(size_t i) {
	ctl_arena_t *ret = arenas_i_impl(tsd_fetch(), i, true, false);
	assert(ret != NULL);
	return ret;
}